

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int lookupName(Parse *pParse,char *zDb,char *zTab,char *zCol,NameContext *pNC,Expr *pExpr)

{
  byte *pbVar1;
  yColCache *pyVar2;
  ushort uVar3;
  sqlite3 *db;
  Db *pDVar4;
  SrcList *pSVar5;
  Table *pTVar6;
  Select *pSVar7;
  ExprList *pEVar8;
  IdList *pIVar9;
  ExprList_item *pEVar10;
  Expr *pExpr_00;
  bool bVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  byte bVar17;
  u8 uVar18;
  long lVar19;
  ulong uVar20;
  char *pcVar21;
  int iVar22;
  uint uVar23;
  Schema *pSVar24;
  ulong uVar25;
  Table **ppTVar26;
  Table **ppTVar27;
  NameContext *pNVar28;
  SrcList_item *pSVar29;
  Schema *pSchema;
  Column *pCVar30;
  uint uVar31;
  uint uVar32;
  long lVar33;
  SrcList_item *local_98;
  int local_64;
  
  db = pParse->db;
  pExpr->iTable = -1;
  pExpr->pTab = (Table *)0x0;
  if ((zDb == (char *)0x0) || (pSchema = (Schema *)0x0, (pNC->ncFlags & 6) != 0)) {
    pSchema = (Schema *)0x0;
    zDb = (char *)0x0;
  }
  else {
    pSVar24 = (Schema *)(ulong)(uint)db->nDb;
    if (db->nDb < 1) {
      pSVar24 = pSchema;
    }
    lVar33 = 0;
    do {
      lVar19 = lVar33;
      if ((long)pSVar24 * 0x20 + 0x20 == lVar19 + 0x20) goto LAB_00152cb5;
      pDVar4 = db->aDb;
      iVar13 = sqlite3StrICmp(*(char **)((long)&pDVar4->zDbSName + lVar19),zDb);
      lVar33 = lVar19 + 0x20;
    } while (iVar13 != 0);
    pSchema = *(Schema **)((long)&pDVar4->pSchema + lVar19);
  }
LAB_00152cb5:
  ppTVar27 = &pParse->pTriggerTab;
  local_64 = 0;
  local_98 = (SrcList_item *)0x0;
  bVar12 = false;
  iVar13 = 0;
  pNVar28 = pNC;
  do {
    iVar16 = 0;
    do {
      if ((iVar16 != 0) || (pNVar28 == (NameContext *)0x0)) {
        if ((zTab == (char *)0x0) && (iVar16 == 0)) {
          if ((pExpr->flags & 0x40) != 0) {
            pExpr->op = 'a';
            pExpr->pTab = (Table *)0x0;
            return 1;
          }
LAB_00153282:
          pcVar21 = "ambiguous column name";
          if (iVar16 == 0) {
            pcVar21 = "no such column";
          }
          if (zDb == (char *)0x0) {
            if (zTab == (char *)0x0) {
              sqlite3ErrorMsg(pParse,"%s: %s",pcVar21,zCol);
            }
            else {
              sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar21,zTab,zCol);
            }
          }
          else {
            sqlite3ErrorMsg(pParse,"%s: %s.%s.%s",pcVar21,zDb,zTab,zCol);
          }
          pParse->checkSchema = '\x01';
          pNC->nErr = pNC->nErr + 1;
        }
        else if (iVar16 != 1) goto LAB_00153282;
        uVar3 = pExpr->iColumn;
        if ((-1 < (short)uVar3) && (local_98 != (SrcList_item *)0x0)) {
          bVar17 = 0x3f;
          if (uVar3 < 0x3f) {
            bVar17 = (byte)uVar3;
          }
          local_98->colUsed = local_98->colUsed | 1L << (bVar17 & 0x3f);
        }
        sqlite3ExprDelete(db,pExpr->pLeft);
        pExpr->pLeft = (Expr *)0x0;
        sqlite3ExprDelete(db,pExpr->pRight);
        pExpr->pRight = (Expr *)0x0;
        uVar18 = 'X';
        if (!bVar12) {
          uVar18 = 0x98;
        }
        pExpr->op = uVar18;
        if (iVar16 != 1) {
          return 2;
        }
        goto LAB_001533f4;
      }
      pSVar5 = pNVar28->pSrcList;
      if (pSVar5 == (SrcList *)0x0) {
        iVar16 = 0;
      }
      else {
        pSVar29 = pSVar5->a;
        iVar16 = 0;
        iVar15 = pSVar5->nSrc;
        if (pSVar5->nSrc < 1) {
          iVar15 = 0;
        }
        for (iVar22 = 0; iVar22 != iVar15; iVar22 = iVar22 + 1) {
          pTVar6 = pSVar29->pTab;
          pSVar7 = pSVar29->pSelect;
          if ((pSVar7 == (Select *)0x0) || ((pSVar7->selFlags & 0x800) == 0)) {
LAB_00152e1f:
            if ((zDb == (char *)0x0) || (pTVar6->pSchema == pSchema)) {
              if (zTab != (char *)0x0) {
                pcVar21 = pSVar29->zAlias;
                if (pcVar21 == (char *)0x0) {
                  pcVar21 = pTVar6->zName;
                }
                iVar14 = sqlite3StrICmp(pcVar21,zTab);
                if (iVar14 != 0) goto LAB_00152f49;
              }
              if (iVar13 == 0) {
                local_98 = pSVar29;
              }
              iVar13 = iVar13 + 1;
              pCVar30 = pTVar6->aCol;
              uVar23 = (uint)(ushort)pTVar6->nCol;
              uVar31 = 0;
              if (pTVar6->nCol < 1) {
                uVar23 = 0;
              }
              for (; uVar31 != uVar23; uVar31 = uVar31 + 1) {
                iVar14 = sqlite3StrICmp(pCVar30->zName,zCol);
                if (iVar14 == 0) {
                  if (iVar16 != 1) {
LAB_00152f0b:
                    iVar16 = iVar16 + 1;
                    if (uVar31 == (int)pTVar6->iPKey) {
                      uVar31 = 0xffff;
                    }
                    pExpr->iColumn = (ynVar)uVar31;
                    local_98 = pSVar29;
                    break;
                  }
                  if (((pSVar29->fg).jointype & 4) == 0) {
                    pIVar9 = pSVar29->pUsing;
                    if (pIVar9 == (IdList *)0x0) goto LAB_00152f0b;
                    uVar32 = pIVar9->nId;
                    if (pIVar9->nId < 1) {
                      uVar32 = 0;
                    }
                    lVar33 = 0;
                    do {
                      if ((ulong)uVar32 * 0x10 + 0x10 == lVar33 + 0x10) goto LAB_00152f0b;
                      iVar14 = sqlite3StrICmp(*(char **)((long)&pIVar9->a->zName + lVar33),zCol);
                      lVar33 = lVar33 + 0x10;
                    } while (iVar14 != 0);
                  }
                }
                pCVar30 = pCVar30 + 1;
              }
            }
          }
          else {
            pEVar8 = pSVar7->pEList;
            uVar31 = pEVar8->nExpr;
            uVar25 = 0;
            uVar20 = (ulong)uVar31;
            if ((int)uVar31 < 1) {
              uVar20 = uVar25;
            }
            lVar33 = 0x10;
            bVar11 = false;
            for (; uVar20 != uVar25; uVar25 = uVar25 + 1) {
              iVar14 = sqlite3MatchSpanName
                                 (*(char **)((long)&pEVar8->a->pExpr + lVar33),zCol,zTab,zDb);
              if (iVar14 != 0) {
                iVar16 = iVar16 + 1;
                pExpr->iColumn = (ynVar)uVar25;
                iVar13 = 2;
                bVar11 = true;
                local_98 = pSVar29;
              }
              lVar33 = lVar33 + 0x20;
            }
            if (!bVar11 && zTab != (char *)0x0) goto LAB_00152e1f;
          }
LAB_00152f49:
          pSVar29 = pSVar29 + 1;
        }
        if (local_98 == (SrcList_item *)0x0) {
          local_98 = (SrcList_item *)0x0;
        }
        else {
          pExpr->iTable = local_98->iCursor;
          pTVar6 = local_98->pTab;
          pExpr->pTab = pTVar6;
          if (((local_98->fg).jointype & 8) != 0) {
            pbVar1 = (byte *)((long)&pExpr->flags + 2);
            *pbVar1 = *pbVar1 | 0x10;
          }
          pSchema = pTVar6->pSchema;
        }
      }
      if (iVar13 == 0 && (zTab != (char *)0x0 && zDb == (char *)0x0)) {
        pTVar6 = *ppTVar27;
        if (pTVar6 == (Table *)0x0) {
LAB_00153019:
          iVar13 = 0;
        }
        else {
          uVar18 = pParse->eTriggerOp;
          if (uVar18 == 'm') {
LAB_00152ff2:
            iVar13 = sqlite3StrICmp("old",zTab);
            if (iVar13 != 0) goto LAB_00153019;
            iVar13 = 0;
            bVar11 = true;
          }
          else {
            iVar13 = sqlite3StrICmp("new",zTab);
            if (iVar13 != 0) {
              if (uVar18 == 'l') goto LAB_00153019;
              goto LAB_00152ff2;
            }
            bVar11 = false;
            iVar13 = 1;
          }
          pExpr->iTable = iVar13;
          pCVar30 = pTVar6->aCol;
          pSchema = pTVar6->pSchema;
          uVar32 = (uint)pTVar6->nCol;
          uVar31 = 0;
          uVar23 = 0;
          if (0 < pTVar6->nCol) {
            uVar31 = uVar32;
            uVar23 = 0;
          }
          for (; uVar31 != uVar23; uVar23 = uVar23 + 1) {
            iVar13 = sqlite3StrICmp(pCVar30->zName,zCol);
            if (iVar13 == 0) {
              uVar31 = uVar23;
              if ((int)pTVar6->iPKey == uVar23) {
                uVar31 = 0xffffffff;
              }
              if ((int)uVar31 < (int)uVar32) goto LAB_00153149;
              break;
            }
            pCVar30 = pCVar30 + 1;
          }
          iVar13 = sqlite3IsRowid(zCol);
          if (iVar13 != 0) {
            uVar31 = uVar31 | -(uint)((pTVar6->tabFlags & 0x40) == 0);
          }
LAB_00153149:
          if ((int)uVar31 < (int)uVar32) {
            if ((int)uVar31 < 0) {
              pExpr->affinity = 'D';
            }
            else {
              uVar23 = 1 << ((byte)uVar31 & 0x1f);
              if (0x1f < uVar31) {
                uVar23 = 0xffffffff;
              }
              if (bVar11) {
                pParse->oldmask = pParse->oldmask | uVar23;
              }
              else {
                pParse->newmask = pParse->newmask | uVar23;
              }
            }
            iVar16 = iVar16 + 1;
            pExpr->iColumn = (ynVar)uVar31;
            pExpr->pTab = pTVar6;
            bVar12 = true;
            iVar13 = 1;
          }
          else {
            iVar13 = 1;
          }
        }
      }
      if (((((iVar16 == 0) && (iVar13 == 1)) && (local_98 != (SrcList_item *)0x0)) &&
          ((iVar16 = 0, (pNVar28->ncFlags & 0x20) == 0 &&
           (iVar15 = sqlite3IsRowid(zCol), iVar15 != 0)))) &&
         ((local_98->pTab->tabFlags & 0x40) == 0)) {
        pExpr->iColumn = -1;
        pExpr->affinity = 'D';
        iVar16 = 1;
      }
      pEVar8 = pNVar28->pEList;
      if ((iVar16 == 0 && zTab == (char *)0x0) && pEVar8 != (ExprList *)0x0) {
        uVar31 = pEVar8->nExpr;
        if (pEVar8->nExpr < 1) {
          uVar31 = 0;
        }
        lVar33 = 8;
        uVar20 = 0;
        goto LAB_001531e1;
      }
    } while (iVar16 != 0);
LAB_0015322b:
    pNVar28 = pNVar28->pNext;
    local_64 = local_64 + 1;
  } while( true );
LAB_001531e1:
  if (uVar31 == uVar20) goto LAB_0015322b;
  pEVar10 = pEVar8->a;
  pcVar21 = *(char **)((long)&pEVar10->pExpr + lVar33);
  if ((pcVar21 != (char *)0x0) && (iVar16 = sqlite3StrICmp(pcVar21,zCol), iVar16 == 0)) {
    pExpr_00 = *(Expr **)((long)pEVar10 + lVar33 + -8);
    if (((pNVar28->ncFlags & 1) == 0) && ((pExpr_00->flags & 2) != 0)) {
      sqlite3ErrorMsg(pParse,"misuse of aliased aggregate %s",pcVar21);
    }
    else {
      iVar13 = sqlite3ExprVectorSize(pExpr_00);
      if (iVar13 == 1) {
        resolveAlias(pParse,pEVar8,(int)uVar20,pExpr,"",local_64);
LAB_001533f4:
        if (((pExpr->flags & 0x400000) == 0) && (pParse->db->xAuth != (sqlite3_xauth)0x0)) {
          pSVar5 = pNVar28->pSrcList;
          iVar13 = sqlite3SchemaToIndex(pParse->db,pSchema);
          if (-1 < iVar13) {
            if (pExpr->op != 'X') {
              uVar31 = pSVar5->nSrc;
              uVar20 = 0;
              if (0 < (int)uVar31) {
                uVar20 = (ulong)uVar31;
              }
              lVar33 = uVar20 + 1;
              ppTVar26 = (Table **)&pSVar5[-1].a[0].pSelect;
              do {
                lVar33 = lVar33 + -1;
                if (lVar33 == 0) goto LAB_0015349e;
                ppTVar27 = ppTVar26 + 0xe;
                pyVar2 = (yColCache *)((long)ppTVar26 + 0x94);
                ppTVar26 = ppTVar27;
              } while (pExpr->iTable != pyVar2->iTable);
            }
            pTVar6 = *ppTVar27;
            if (pTVar6 != (Table *)0x0) {
              lVar33 = (long)pExpr->iColumn;
              if ((pExpr->iColumn < 0) && (lVar33 = (long)pTVar6->iPKey, lVar33 < 0)) {
                pcVar21 = "ROWID";
              }
              else {
                pcVar21 = pTVar6->aCol[lVar33].zName;
              }
              iVar13 = sqlite3AuthReadCol(pParse,pTVar6->zName,pcVar21,iVar13);
              if (iVar13 == 2) {
                pExpr->op = 'e';
              }
            }
          }
        }
LAB_0015349e:
        for (; pNC->nRef = pNC->nRef + 1, pNC != pNVar28; pNC = pNC->pNext) {
        }
        return 1;
      }
      sqlite3ErrorMsg(pParse,"row value misused");
    }
    return 2;
  }
  uVar20 = uVar20 + 1;
  lVar33 = lVar33 + 0x20;
  goto LAB_001531e1;
}

Assistant:

static int lookupName(
  Parse *pParse,       /* The parsing context */
  const char *zDb,     /* Name of the database containing table, or NULL */
  const char *zTab,    /* Name of table containing column, or NULL */
  const char *zCol,    /* Name of the column. */
  NameContext *pNC,    /* The name context used to resolve the name */
  Expr *pExpr          /* Make this EXPR node point to the selected column */
){
  int i, j;                         /* Loop counters */
  int cnt = 0;                      /* Number of matching column names */
  int cntTab = 0;                   /* Number of matching table names */
  int nSubquery = 0;                /* How many levels of subquery */
  sqlite3 *db = pParse->db;         /* The database connection */
  struct SrcList_item *pItem;       /* Use for looping over pSrcList items */
  struct SrcList_item *pMatch = 0;  /* The matching pSrcList item */
  NameContext *pTopNC = pNC;        /* First namecontext in the list */
  Schema *pSchema = 0;              /* Schema of the expression */
  int isTrigger = 0;                /* True if resolved to a trigger column */
  Table *pTab = 0;                  /* Table hold the row */
  Column *pCol;                     /* A column of pTab */

  assert( pNC );     /* the name context cannot be NULL. */
  assert( zCol );    /* The Z in X.Y.Z cannot be NULL */
  assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );

  /* Initialize the node to no-match */
  pExpr->iTable = -1;
  pExpr->pTab = 0;
  ExprSetVVAProperty(pExpr, EP_NoReduce);

  /* Translate the schema name in zDb into a pointer to the corresponding
  ** schema.  If not found, pSchema will remain NULL and nothing will match
  ** resulting in an appropriate error message toward the end of this routine
  */
  if( zDb ){
    testcase( pNC->ncFlags & NC_PartIdx );
    testcase( pNC->ncFlags & NC_IsCheck );
    if( (pNC->ncFlags & (NC_PartIdx|NC_IsCheck))!=0 ){
      /* Silently ignore database qualifiers inside CHECK constraints and
      ** partial indices.  Do not raise errors because that might break
      ** legacy and because it does not hurt anything to just ignore the
      ** database name. */
      zDb = 0;
    }else{
      for(i=0; i<db->nDb; i++){
        assert( db->aDb[i].zDbSName );
        if( sqlite3StrICmp(db->aDb[i].zDbSName,zDb)==0 ){
          pSchema = db->aDb[i].pSchema;
          break;
        }
      }
    }
  }

  /* Start at the inner-most context and move outward until a match is found */
  while( pNC && cnt==0 ){
    ExprList *pEList;
    SrcList *pSrcList = pNC->pSrcList;

    if( pSrcList ){
      for(i=0, pItem=pSrcList->a; i<pSrcList->nSrc; i++, pItem++){
        pTab = pItem->pTab;
        assert( pTab!=0 && pTab->zName!=0 );
        assert( pTab->nCol>0 );
        if( pItem->pSelect && (pItem->pSelect->selFlags & SF_NestedFrom)!=0 ){
          int hit = 0;
          pEList = pItem->pSelect->pEList;
          for(j=0; j<pEList->nExpr; j++){
            if( sqlite3MatchSpanName(pEList->a[j].zSpan, zCol, zTab, zDb) ){
              cnt++;
              cntTab = 2;
              pMatch = pItem;
              pExpr->iColumn = j;
              hit = 1;
            }
          }
          if( hit || zTab==0 ) continue;
        }
        if( zDb && pTab->pSchema!=pSchema ){
          continue;
        }
        if( zTab ){
          const char *zTabName = pItem->zAlias ? pItem->zAlias : pTab->zName;
          assert( zTabName!=0 );
          if( sqlite3StrICmp(zTabName, zTab)!=0 ){
            continue;
          }
        }
        if( 0==(cntTab++) ){
          pMatch = pItem;
        }
        for(j=0, pCol=pTab->aCol; j<pTab->nCol; j++, pCol++){
          if( sqlite3StrICmp(pCol->zName, zCol)==0 ){
            /* If there has been exactly one prior match and this match
            ** is for the right-hand table of a NATURAL JOIN or is in a 
            ** USING clause, then skip this match.
            */
            if( cnt==1 ){
              if( pItem->fg.jointype & JT_NATURAL ) continue;
              if( nameInUsingClause(pItem->pUsing, zCol) ) continue;
            }
            cnt++;
            pMatch = pItem;
            /* Substitute the rowid (column -1) for the INTEGER PRIMARY KEY */
            pExpr->iColumn = j==pTab->iPKey ? -1 : (i16)j;
            break;
          }
        }
      }
      if( pMatch ){
        pExpr->iTable = pMatch->iCursor;
        pExpr->pTab = pMatch->pTab;
        /* RIGHT JOIN not (yet) supported */
        assert( (pMatch->fg.jointype & JT_RIGHT)==0 );
        if( (pMatch->fg.jointype & JT_LEFT)!=0 ){
          ExprSetProperty(pExpr, EP_CanBeNull);
        }
        pSchema = pExpr->pTab->pSchema;
      }
    } /* if( pSrcList ) */

#ifndef SQLITE_OMIT_TRIGGER
    /* If we have not already resolved the name, then maybe 
    ** it is a new.* or old.* trigger argument reference
    */
    if( zDb==0 && zTab!=0 && cntTab==0 && pParse->pTriggerTab!=0 ){
      int op = pParse->eTriggerOp;
      assert( op==TK_DELETE || op==TK_UPDATE || op==TK_INSERT );
      if( op!=TK_DELETE && sqlite3StrICmp("new",zTab) == 0 ){
        pExpr->iTable = 1;
        pTab = pParse->pTriggerTab;
      }else if( op!=TK_INSERT && sqlite3StrICmp("old",zTab)==0 ){
        pExpr->iTable = 0;
        pTab = pParse->pTriggerTab;
      }else{
        pTab = 0;
      }

      if( pTab ){ 
        int iCol;
        pSchema = pTab->pSchema;
        cntTab++;
        for(iCol=0, pCol=pTab->aCol; iCol<pTab->nCol; iCol++, pCol++){
          if( sqlite3StrICmp(pCol->zName, zCol)==0 ){
            if( iCol==pTab->iPKey ){
              iCol = -1;
            }
            break;
          }
        }
        if( iCol>=pTab->nCol && sqlite3IsRowid(zCol) && VisibleRowid(pTab) ){
          /* IMP: R-51414-32910 */
          iCol = -1;
        }
        if( iCol<pTab->nCol ){
          cnt++;
          if( iCol<0 ){
            pExpr->affinity = SQLITE_AFF_INTEGER;
          }else if( pExpr->iTable==0 ){
            testcase( iCol==31 );
            testcase( iCol==32 );
            pParse->oldmask |= (iCol>=32 ? 0xffffffff : (((u32)1)<<iCol));
          }else{
            testcase( iCol==31 );
            testcase( iCol==32 );
            pParse->newmask |= (iCol>=32 ? 0xffffffff : (((u32)1)<<iCol));
          }
          pExpr->iColumn = (i16)iCol;
          pExpr->pTab = pTab;
          isTrigger = 1;
        }
      }
    }
#endif /* !defined(SQLITE_OMIT_TRIGGER) */

    /*
    ** Perhaps the name is a reference to the ROWID
    */
    if( cnt==0
     && cntTab==1
     && pMatch
     && (pNC->ncFlags & NC_IdxExpr)==0
     && sqlite3IsRowid(zCol)
     && VisibleRowid(pMatch->pTab)
    ){
      cnt = 1;
      pExpr->iColumn = -1;
      pExpr->affinity = SQLITE_AFF_INTEGER;
    }

    /*
    ** If the input is of the form Z (not Y.Z or X.Y.Z) then the name Z
    ** might refer to an result-set alias.  This happens, for example, when
    ** we are resolving names in the WHERE clause of the following command:
    **
    **     SELECT a+b AS x FROM table WHERE x<10;
    **
    ** In cases like this, replace pExpr with a copy of the expression that
    ** forms the result set entry ("a+b" in the example) and return immediately.
    ** Note that the expression in the result set should have already been
    ** resolved by the time the WHERE clause is resolved.
    **
    ** The ability to use an output result-set column in the WHERE, GROUP BY,
    ** or HAVING clauses, or as part of a larger expression in the ORDER BY
    ** clause is not standard SQL.  This is a (goofy) SQLite extension, that
    ** is supported for backwards compatibility only. Hence, we issue a warning
    ** on sqlite3_log() whenever the capability is used.
    */
    if( (pEList = pNC->pEList)!=0
     && zTab==0
     && cnt==0
    ){
      for(j=0; j<pEList->nExpr; j++){
        char *zAs = pEList->a[j].zName;
        if( zAs!=0 && sqlite3StrICmp(zAs, zCol)==0 ){
          Expr *pOrig;
          assert( pExpr->pLeft==0 && pExpr->pRight==0 );
          assert( pExpr->x.pList==0 );
          assert( pExpr->x.pSelect==0 );
          pOrig = pEList->a[j].pExpr;
          if( (pNC->ncFlags&NC_AllowAgg)==0 && ExprHasProperty(pOrig, EP_Agg) ){
            sqlite3ErrorMsg(pParse, "misuse of aliased aggregate %s", zAs);
            return WRC_Abort;
          }
          if( sqlite3ExprVectorSize(pOrig)!=1 ){
            sqlite3ErrorMsg(pParse, "row value misused");
            return WRC_Abort;
          }
          resolveAlias(pParse, pEList, j, pExpr, "", nSubquery);
          cnt = 1;
          pMatch = 0;
          assert( zTab==0 && zDb==0 );
          goto lookupname_end;
        }
      } 
    }

    /* Advance to the next name context.  The loop will exit when either
    ** we have a match (cnt>0) or when we run out of name contexts.
    */
    if( cnt==0 ){
      pNC = pNC->pNext;
      nSubquery++;
    }
  }

  /*
  ** If X and Y are NULL (in other words if only the column name Z is
  ** supplied) and the value of Z is enclosed in double-quotes, then
  ** Z is a string literal if it doesn't match any column names.  In that
  ** case, we need to return right away and not make any changes to
  ** pExpr.
  **
  ** Because no reference was made to outer contexts, the pNC->nRef
  ** fields are not changed in any context.
  */
  if( cnt==0 && zTab==0 && ExprHasProperty(pExpr,EP_DblQuoted) ){
    pExpr->op = TK_STRING;
    pExpr->pTab = 0;
    return WRC_Prune;
  }

  /*
  ** cnt==0 means there was not match.  cnt>1 means there were two or
  ** more matches.  Either way, we have an error.
  */
  if( cnt!=1 ){
    const char *zErr;
    zErr = cnt==0 ? "no such column" : "ambiguous column name";
    if( zDb ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s.%s", zErr, zDb, zTab, zCol);
    }else if( zTab ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s", zErr, zTab, zCol);
    }else{
      sqlite3ErrorMsg(pParse, "%s: %s", zErr, zCol);
    }
    pParse->checkSchema = 1;
    pTopNC->nErr++;
  }

  /* If a column from a table in pSrcList is referenced, then record
  ** this fact in the pSrcList.a[].colUsed bitmask.  Column 0 causes
  ** bit 0 to be set.  Column 1 sets bit 1.  And so forth.  If the
  ** column number is greater than the number of bits in the bitmask
  ** then set the high-order bit of the bitmask.
  */
  if( pExpr->iColumn>=0 && pMatch!=0 ){
    int n = pExpr->iColumn;
    testcase( n==BMS-1 );
    if( n>=BMS ){
      n = BMS-1;
    }
    assert( pMatch->iCursor==pExpr->iTable );
    pMatch->colUsed |= ((Bitmask)1)<<n;
  }

  /* Clean up and return
  */
  sqlite3ExprDelete(db, pExpr->pLeft);
  pExpr->pLeft = 0;
  sqlite3ExprDelete(db, pExpr->pRight);
  pExpr->pRight = 0;
  pExpr->op = (isTrigger ? TK_TRIGGER : TK_COLUMN);
lookupname_end:
  if( cnt==1 ){
    assert( pNC!=0 );
    if( !ExprHasProperty(pExpr, EP_Alias) ){
      sqlite3AuthRead(pParse, pExpr, pSchema, pNC->pSrcList);
    }
    /* Increment the nRef value on all name contexts from TopNC up to
    ** the point where the name matched. */
    for(;;){
      assert( pTopNC!=0 );
      pTopNC->nRef++;
      if( pTopNC==pNC ) break;
      pTopNC = pTopNC->pNext;
    }
    return WRC_Prune;
  } else {
    return WRC_Abort;
  }
}